

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionSystemBullet.cpp
# Opt level: O2

void __thiscall
chrono::collision::ChCollisionSystemBullet::~ChCollisionSystemBullet(ChCollisionSystemBullet *this)

{
  ~ChCollisionSystemBullet(this);
  ::operator_delete(this,0xc0);
  return;
}

Assistant:

ChCollisionSystemBullet::~ChCollisionSystemBullet() {
    delete bt_collision_world;
    delete bt_broadphase;
    delete bt_dispatcher;
    delete bt_collision_configuration;

    delete m_debug_drawer;

    delete m_collision_capsule_box;
    delete m_collision_box_capsule;
    delete m_collision_cylshell_box;
    delete m_collision_box_cylshell;
    delete m_collision_arc_seg;
    delete m_collision_seg_arc;
    delete m_collision_arc_arc;
    delete m_collision_cetri_cetri;
    m_emptyCreateFunc->~cbtCollisionAlgorithmCreateFunc();
    cbtAlignedFree(m_tmp_mem);
}